

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi_uc *psVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  stbi_uc sVar12;
  ulong uVar13;
  stbi_uc *psVar14;
  long lVar15;
  stbi__uint32 sVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  undefined1 local_a2c [8];
  stbi__zhuffman z_codelength;
  stbi_uc lencodes [455];
  byte local_78 [32];
  stbi__zhuffman *local_58;
  ulong local_50;
  uint local_44;
  stbi__zhuffman *local_40;
  int local_34;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0010ddb2:
    a->num_bits = 0;
    a->code_buffer = 0;
    local_58 = &a->z_length;
    local_40 = &a->z_distance;
    iVar9 = 0;
    do {
      if (iVar9 < 1) {
        stbi__fill_bits(a);
        iVar9 = a->num_bits;
      }
      local_44 = a->code_buffer;
      sVar16 = local_44 >> 1;
      a->code_buffer = sVar16;
      iVar4 = iVar9 + -1;
      a->num_bits = iVar4;
      if (iVar9 < 3) {
        stbi__fill_bits(a);
        iVar4 = a->num_bits;
        sVar16 = a->code_buffer;
      }
      sVar17 = sVar16 >> 2;
      a->code_buffer = sVar17;
      uVar3 = iVar4 - 2;
      a->num_bits = uVar3;
      switch(sVar16 & 3) {
      case 0:
        uVar7 = uVar3 & 7;
        if (uVar7 != 0) {
          if (iVar4 < 2) {
            stbi__fill_bits(a);
            uVar3 = a->num_bits;
            sVar17 = a->code_buffer;
          }
          sVar17 = sVar17 >> (sbyte)uVar7;
          a->code_buffer = sVar17;
          uVar3 = uVar3 - uVar7;
          a->num_bits = uVar3;
        }
        if ((int)uVar3 < 1) {
          if (uVar3 != 0) goto LAB_0010e747;
          uVar21 = 0;
LAB_0010e622:
          psVar14 = a->zbuffer;
          psVar1 = a->zbuffer_end;
          do {
            if (psVar14 < psVar1) {
              a->zbuffer = psVar14 + 1;
              sVar12 = *psVar14;
              psVar14 = psVar14 + 1;
            }
            else {
              sVar12 = '\0';
            }
            local_a2c[uVar21] = sVar12;
            uVar21 = uVar21 + 1;
          } while (uVar21 != 4);
        }
        else {
          uVar7 = uVar3 - 1 >> 3;
          uVar21 = (ulong)(uVar7 + 1);
          uVar13 = 0xffffffffffffffff;
          do {
            local_a2c[uVar13 + 1] = (char)sVar17;
            sVar17 = sVar17 >> 8;
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
          a->code_buffer = sVar17;
          iVar9 = (uVar3 - 8) - (uVar3 - 1 & 0xfffffff8);
          a->num_bits = iVar9;
          if (iVar9 != 0) {
LAB_0010e747:
            __assert_fail("a->num_bits == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0xe8d,"int stbi__parse_uncomperssed_block(stbi__zbuf *)");
          }
          if (uVar13 < 3) goto LAB_0010e622;
        }
        if ((local_a2c._2_2_ ^ local_a2c._0_2_) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          return 0;
        }
        psVar14 = a->zbuffer;
        uVar21 = (ulong)(ushort)local_a2c._0_2_;
        if (a->zbuffer_end < psVar14 + uVar21) {
          stbi__g_failure_reason = "read past buffer";
          return 0;
        }
        pcVar19 = a->zout;
        if (a->zout_end < pcVar19 + uVar21) {
          iVar9 = stbi__zexpand(a,pcVar19,(uint)(ushort)local_a2c._0_2_);
          if (iVar9 == 0) {
            return 0;
          }
          psVar14 = a->zbuffer;
          pcVar19 = a->zout;
        }
        memcpy(pcVar19,psVar14,uVar21);
        a->zbuffer = a->zbuffer + uVar21;
        a->zout = a->zout + uVar21;
        goto LAB_0010e6bb;
      case 1:
        if (stbi__zdefault_distance[0x1f] == '\0') {
          memset(stbi__zdefault_length,8,0x90);
          builtin_memcpy(stbi__zdefault_length + 0x90,
                         "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                         ,0x90);
          builtin_memcpy(stbi__zdefault_distance,
                         "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                         ,0x20);
        }
        iVar9 = stbi__zbuild_huffman(local_58,stbi__zdefault_length,0x120);
        if (iVar9 == 0) {
          return 0;
        }
        psVar14 = stbi__zdefault_distance;
        iVar9 = 0x20;
        break;
      case 2:
        if (iVar4 < 7) {
          stbi__fill_bits(a);
          uVar3 = a->num_bits;
          sVar17 = a->code_buffer;
        }
        sVar16 = sVar17 >> 5;
        a->code_buffer = sVar16;
        iVar9 = uVar3 - 5;
        a->num_bits = iVar9;
        if ((int)uVar3 < 10) {
          stbi__fill_bits(a);
          iVar9 = a->num_bits;
          sVar16 = a->code_buffer;
        }
        uVar3 = sVar16 >> 5;
        a->code_buffer = uVar3;
        iVar4 = iVar9 + -5;
        a->num_bits = iVar4;
        if (iVar9 < 9) {
          stbi__fill_bits(a);
          iVar4 = a->num_bits;
          uVar3 = a->code_buffer;
        }
        uVar18 = (sVar17 & 0x1f) + 0x101;
        local_50 = (ulong)((sVar16 & 0x1f) + 1);
        uVar7 = uVar3 >> 4;
        a->code_buffer = uVar7;
        iVar4 = iVar4 + -4;
        a->num_bits = iVar4;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[8] = 0;
        local_78[9] = 0;
        local_78[10] = 0;
        local_78[0xb] = 0;
        local_78[0xc] = 0;
        local_78[0xd] = 0;
        local_78[0xe] = 0;
        local_78[0xf] = 0;
        local_78[0x10] = 0;
        local_78[0x11] = 0;
        local_78[0x12] = 0;
        uVar21 = 0;
        do {
          uVar8 = uVar7;
          if (iVar4 < 3) {
            stbi__fill_bits(a);
            iVar4 = a->num_bits;
            uVar8 = a->code_buffer;
          }
          uVar7 = uVar8 >> 3;
          a->code_buffer = uVar7;
          iVar4 = iVar4 + -3;
          a->num_bits = iVar4;
          local_78[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar21]] =
               (byte)uVar8 & 7;
          uVar21 = uVar21 + 1;
        } while ((uVar3 & 0xf) + 4 != uVar21);
        iVar9 = stbi__zbuild_huffman((stbi__zhuffman *)local_a2c,local_78,0x13);
        if (iVar9 == 0) {
          return 0;
        }
        iVar4 = (int)local_50 + uVar18;
        iVar9 = a->num_bits;
        iVar20 = 0;
        local_34 = iVar4;
        do {
          if (iVar9 < 0x10) {
            stbi__fill_bits(a);
          }
          uVar3 = a->code_buffer;
          uVar6 = *(ushort *)(local_a2c + (ulong)(uVar3 & 0x1ff) * 2);
          if (uVar6 == 0) {
            uVar6 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
            uVar7 = (uVar6 & 0xf0f) << 4 | (uVar6 & 0xf0f0) >> 4;
            uVar7 = (uVar7 >> 2 & 0x3333) + (uVar7 & 0x3333) * 4;
            uVar7 = (uVar7 >> 1 & 0x5555) + (uVar7 & 0x5555) * 2;
            lVar5 = 0;
            do {
              lVar11 = lVar5;
              lVar5 = lVar11 + 1;
            } while (z_codelength.maxcode[lVar11 + 8] <= (int)uVar7);
            if (lVar5 == 7) goto LAB_0010e6c9;
            lVar15 = (ulong)z_codelength.firstsymbol[lVar11 + 6] +
                     ((ulong)(uVar7 >> (7U - (char)lVar5 & 0x1f)) -
                     (ulong)z_codelength.firstcode[lVar11 + 6]);
            if ((ulong)*(byte *)((long)&z_codelength + lVar15 + 0x47c) - 9 != lVar5)
            goto LAB_0010e728;
            uVar3 = uVar3 >> ((char)lVar11 + 10U & 0x1f);
            a->code_buffer = uVar3;
            iVar9 = (a->num_bits - (int)lVar5) + -9;
            a->num_bits = iVar9;
            uVar6 = *(ushort *)((long)&z_codelength + lVar15 * 2 + 0x59c);
          }
          else {
            uVar3 = uVar3 >> ((byte)(uVar6 >> 9) & 0x1f);
            a->code_buffer = uVar3;
            iVar9 = a->num_bits - (uint)(uVar6 >> 9);
            a->num_bits = iVar9;
            uVar6 = uVar6 & 0x1ff;
          }
          if (0x12 < uVar6) goto LAB_0010e6c9;
          if (uVar6 < 0x10) {
            lVar5 = (long)iVar20;
            iVar20 = iVar20 + 1;
            lencodes[lVar5 + -8] = (stbi_uc)uVar6;
          }
          else {
            if (uVar6 == 0x11) {
              if (iVar9 < 3) {
                stbi__fill_bits(a);
                iVar9 = a->num_bits;
                uVar3 = a->code_buffer;
              }
              uVar7 = uVar3 & 7;
              a->code_buffer = uVar3 >> 3;
              iVar9 = iVar9 + -3;
              a->num_bits = iVar9;
              psVar14 = lencodes + (long)iVar20 + -8;
              uVar3 = 0;
            }
            else {
              if (uVar6 != 0x10) {
                if (iVar9 < 7) {
                  stbi__fill_bits(a);
                  iVar9 = a->num_bits;
                  uVar3 = a->code_buffer;
                }
                a->code_buffer = uVar3 >> 7;
                iVar9 = iVar9 + -7;
                a->num_bits = iVar9;
                memset(lencodes + (long)iVar20 + -8,0,(ulong)((uVar3 & 0x7f) + 0xb));
                iVar20 = iVar20 + (uVar3 & 0x7f) + 0xb;
                iVar4 = local_34;
                goto LAB_0010e279;
              }
              if (iVar9 < 2) {
                stbi__fill_bits(a);
                iVar9 = a->num_bits;
                uVar3 = a->code_buffer;
              }
              uVar7 = uVar3 & 3;
              a->code_buffer = uVar3 >> 2;
              iVar9 = iVar9 + -2;
              a->num_bits = iVar9;
              psVar14 = lencodes + (long)iVar20 + -8;
              uVar3 = (uint)lencodes[(long)iVar20 + -9];
            }
            memset(psVar14,uVar3,(ulong)(uVar7 + 3));
            iVar20 = iVar20 + uVar7 + 3;
            iVar4 = local_34;
          }
LAB_0010e279:
        } while (iVar20 < iVar4);
        if (iVar20 != iVar4) {
LAB_0010e6c9:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar9 = stbi__zbuild_huffman(local_58,(stbi_uc *)(z_codelength.value + 0x11c),uVar18);
        if (iVar9 == 0) {
          return 0;
        }
        psVar14 = lencodes + ((ulong)uVar18 - 8);
        iVar9 = (int)local_50;
        break;
      case 3:
        goto switchD_0010de31_caseD_3;
      }
      iVar9 = stbi__zbuild_huffman(local_40,psVar14,iVar9);
      if (iVar9 == 0) {
        return 0;
      }
      pcVar19 = a->zout;
      while( true ) {
        while( true ) {
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar3 = a->code_buffer;
          uVar6 = (a->z_length).fast[uVar3 & 0x1ff];
          if (uVar6 == 0) {
            uVar6 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
            uVar7 = (uVar6 & 0xf0f) << 4 | (uVar6 & 0xf0f0) >> 4;
            uVar7 = (uVar7 >> 2 & 0x3333) + (uVar7 & 0x3333) * 4;
            uVar7 = (uVar7 >> 1 & 0x5555) + (uVar7 & 0x5555) * 2;
            lVar5 = 0;
            do {
              lVar11 = lVar5;
              lVar5 = lVar11 + 1;
            } while ((a->z_length).maxcode[lVar11 + 10] <= (int)uVar7);
            if (lVar5 == 7) goto LAB_0010e6db;
            lVar15 = (ulong)(a->z_length).firstsymbol[lVar11 + 10] +
                     ((ulong)(uVar7 >> (7U - (char)lVar5 & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar11 + 10]);
            if ((ulong)*(byte *)((long)a + lVar15 + 0x4b8) - 9 != lVar5) goto LAB_0010e728;
            uVar3 = uVar3 >> ((char)lVar11 + 10U & 0x1f);
            a->code_buffer = uVar3;
            iVar9 = (a->num_bits - (int)lVar5) + -9;
            a->num_bits = iVar9;
            uVar7 = (uint)*(ushort *)((long)a + lVar15 * 2 + 0x5d8);
          }
          else {
            uVar3 = uVar3 >> ((byte)(uVar6 >> 9) & 0x1f);
            a->code_buffer = uVar3;
            iVar9 = a->num_bits - (uint)(uVar6 >> 9);
            a->num_bits = iVar9;
            uVar7 = uVar6 & 0x1ff;
          }
          if (0xff < uVar7) break;
          if (a->zout_end <= pcVar19) {
            iVar9 = stbi__zexpand(a,pcVar19,1);
            if (iVar9 == 0) {
              return 0;
            }
            pcVar19 = a->zout;
          }
          *pcVar19 = (char)uVar7;
          pcVar19 = pcVar19 + 1;
        }
        if (uVar7 == 0x100) break;
        uVar21 = (ulong)(uVar7 - 0x101);
        uVar7 = stbi__zlength_base[uVar21];
        if (0xffffffffffffffeb < uVar21 - 0x1c) {
          iVar4 = stbi__zlength_extra[uVar21];
          if (iVar9 < iVar4) {
            stbi__fill_bits(a);
            iVar9 = a->num_bits;
            uVar3 = a->code_buffer;
          }
          uVar18 = ~(-1 << ((byte)iVar4 & 0x1f)) & uVar3;
          uVar3 = uVar3 >> ((byte)iVar4 & 0x1f);
          a->code_buffer = uVar3;
          iVar9 = iVar9 - iVar4;
          a->num_bits = iVar9;
          uVar7 = uVar7 + uVar18;
        }
        if (iVar9 < 0x10) {
          stbi__fill_bits(a);
          uVar3 = a->code_buffer;
        }
        uVar6 = local_40->fast[uVar3 & 0x1ff];
        if (uVar6 == 0) {
          uVar6 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
          uVar18 = (uVar6 & 0xf0f) << 4 | (uVar6 & 0xf0f0) >> 4;
          uVar18 = (uVar18 >> 2 & 0x3333) + (uVar18 & 0x3333) * 4;
          uVar18 = (uVar18 >> 1 & 0x5555) + (uVar18 & 0x5555) * 2;
          lVar5 = 0;
          do {
            lVar11 = lVar5;
            lVar5 = lVar11 + 1;
          } while ((a->z_distance).maxcode[lVar11 + 10] <= (int)uVar18);
          if (lVar5 == 7) {
LAB_0010e6db:
            stbi__g_failure_reason = "bad huffman code";
            return 0;
          }
          lVar15 = (ulong)(a->z_distance).firstsymbol[lVar11 + 10] +
                   ((ulong)(uVar18 >> (7U - (char)lVar5 & 0x1f)) -
                   (ulong)(a->z_distance).firstcode[lVar11 + 10]);
          if ((ulong)*(byte *)((long)a + lVar15 + 0xc9c) - 9 != lVar5) {
LAB_0010e728:
            __assert_fail("z->size[b] == s",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0xdf4,
                          "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
          }
          uVar3 = uVar3 >> ((char)lVar11 + 10U & 0x1f);
          a->code_buffer = uVar3;
          iVar9 = (a->num_bits - (int)lVar5) + -9;
          a->num_bits = iVar9;
          uVar18 = (uint)*(ushort *)((long)a + lVar15 * 2 + 0xdbc);
        }
        else {
          uVar3 = uVar3 >> ((byte)(uVar6 >> 9) & 0x1f);
          a->code_buffer = uVar3;
          iVar9 = a->num_bits - (uint)(uVar6 >> 9);
          a->num_bits = iVar9;
          uVar18 = uVar6 & 0x1ff;
        }
        uVar21 = (ulong)uVar18;
        iVar4 = stbi__zdist_base[uVar21];
        if (0xffffffffffffffe5 < uVar21 - 0x1e) {
          iVar20 = stbi__zdist_extra[uVar21];
          if (iVar9 < iVar20) {
            stbi__fill_bits(a);
            iVar9 = a->num_bits;
            uVar3 = a->code_buffer;
          }
          a->code_buffer = uVar3 >> ((byte)iVar20 & 0x1f);
          a->num_bits = iVar9 - iVar20;
          iVar4 = iVar4 + (~(-1 << ((byte)iVar20 & 0x1f)) & uVar3);
        }
        if ((long)pcVar19 - (long)a->zout_start < (long)iVar4) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < pcVar19 + (int)uVar7) {
          iVar9 = stbi__zexpand(a,pcVar19,uVar7);
          if (iVar9 == 0) {
            return 0;
          }
          pcVar19 = a->zout;
        }
        lVar5 = -(long)iVar4;
        if (iVar4 == 1) {
          if (uVar7 != 0) {
            memset(pcVar19,(uint)(byte)pcVar19[lVar5],(ulong)uVar7);
            pcVar19 = pcVar19 + (ulong)(uVar7 - 1) + 1;
          }
        }
        else {
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            *pcVar19 = pcVar19[lVar5];
            pcVar19 = pcVar19 + 1;
          }
        }
      }
      a->zout = pcVar19;
LAB_0010e6bb:
      if ((local_44 & 1) != 0) {
        return 1;
      }
      iVar9 = a->num_bits;
    } while( true );
  }
  pbVar10 = a->zbuffer;
  uVar6 = 0;
  if (pbVar10 < a->zbuffer_end) {
    a->zbuffer = pbVar10 + 1;
    bVar2 = *pbVar10;
    pbVar10 = pbVar10 + 1;
  }
  else {
    bVar2 = 0;
  }
  if (pbVar10 < a->zbuffer_end) {
    a->zbuffer = pbVar10 + 1;
    uVar6 = (ushort)*pbVar10;
  }
  if ((ushort)(((ushort)bVar2 << 8 | uVar6) * 0x7bdf) < 0x843) {
    if ((uVar6 & 0x20) == 0) {
      if ((bVar2 & 0xf) == 8) goto LAB_0010ddb2;
      stbi__g_failure_reason = "bad compression";
    }
    else {
      stbi__g_failure_reason = "no preset dict";
    }
  }
  else {
    stbi__g_failure_reason = "bad zlib header";
  }
switchD_0010de31_caseD_3:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}